

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O1

int lejp_parse(lejp_ctx *ctx,uchar *json,int len)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  byte bVar12;
  ushort uVar13;
  uint16_t uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint8_t uVar18;
  long lVar19;
  undefined8 uVar20;
  int iVar21;
  
  if ((ctx->sp == '\0') && (ctx->pst[ctx->pst_sp].ppos == '\0')) {
    (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x02');
  }
  if (len != 0) {
    do {
      iVar1 = len + -1;
      pbVar2 = json + 1;
      bVar12 = *json;
      uVar17 = (ulong)bVar12;
      bVar6 = ctx->sp;
      uVar10 = (ulong)bVar6;
      bVar3 = ctx->st[uVar10].s;
      if (uVar17 < 0x24) {
        if ((0x900002200U >> (uVar17 & 0x3f) & 1) == 0) {
          if (uVar17 != 10) goto LAB_0013b298;
          ctx->line = ctx->line + 1;
          ctx->st[uVar10].s = bVar3 & 0xdf;
        }
        if ((bVar3 & 0x40) != 0) goto LAB_0013b298;
        if (bVar12 == 0x23) {
          ctx->st[uVar10].s = ctx->st[uVar10].s | 0x20;
        }
        goto switchD_0013b2b9_caseD_49;
      }
LAB_0013b298:
      bVar4 = ctx->st[uVar10].s;
      if ((bVar4 & 0x20) != 0) goto switchD_0013b2b9_caseD_49;
      uVar15 = (uint)bVar12;
      uVar9 = (uint)bVar6;
      switch(bVar3) {
      case 0x43:
        if (bVar12 == 0x5c) {
          ctx->st[uVar10].s = 'D';
        }
        else {
          if (bVar12 != 0x22) {
            if (bVar12 < 0x20) {
              iVar21 = 0xfa;
              goto LAB_0013bf47;
            }
            goto LAB_0013b92c;
          }
          if (uVar10 == 0) {
            iVar21 = 0xfb;
            goto LAB_0013bf47;
          }
          if (ctx->st[uVar9 - 1].s != '\t') {
            ctx->buf[ctx->npos] = '\0';
            cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'M');
            if (cVar7 < '\0') goto LAB_0013be2d;
          }
          ctx->sp = ctx->sp + 0xff;
        }
        break;
      case 0x44:
        if (bVar12 != 0x75) {
          lVar19 = 0;
          while (uVar15 != (int)"\"\\/bfnrt"[lVar19]) {
            lVar19 = lVar19 + 1;
            if (lVar19 == 9) {
              iVar21 = 0xf9;
              goto LAB_0013bf47;
            }
          }
          bVar12 = "\"\\/\b\f\n\r\t"[lVar19];
LAB_0013b924:
          ctx->st[uVar10].s = 'C';
          goto LAB_0013b92c;
        }
        ctx->st[uVar10].s = 'E';
        ctx->uni = 0;
        break;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
        uVar5 = ctx->uni;
        ctx->uni = uVar5 * 0x10;
        uVar13 = (ushort)bVar12;
        if ((byte)(bVar12 - 0x30) < 10) {
          uVar14 = (uVar13 + uVar5 * 0x10) - 0x30;
        }
        else if ((byte)(bVar12 + 0x9f) < 6) {
          uVar14 = uVar13 - 0x57;
        }
        else {
          if (5 < (byte)(bVar12 + 0xbf)) {
            iVar21 = 0xf8;
            goto LAB_0013bf47;
          }
          uVar14 = uVar13 - 0x37;
        }
        ctx->uni = uVar14;
        ctx->st[uVar10].s = bVar4 + 1;
        if (bVar3 == 0x48) {
          uVar15._0_2_ = ctx->uni;
          uVar15._2_1_ = ctx->npos;
          uVar15._3_1_ = ctx->dcount;
          uVar16 = (uint)((byte)(undefined2)uVar15 & 0x3f | 0x80);
          if ((ushort)(undefined2)uVar15 < 0x80) {
            uVar16 = uVar15;
          }
          bVar12 = (byte)uVar16;
          goto LAB_0013b924;
        }
        if (bVar3 == 0x47) {
          uVar13 = ctx->uni;
          if (uVar13 < 0x80) {
            if (uVar13 < 8) break;
            bVar12 = (byte)uVar13 >> 2 | 0xc0;
          }
          else {
            bVar12 = (byte)uVar13 >> 2 | 0x80;
          }
        }
        else {
          if ((bVar3 != 0x46) || (ctx->uni < 8)) break;
          bVar12 = (byte)(ctx->uni >> 4) & 0xf | 0xe0;
        }
LAB_0013b92c:
        if ((uVar10 == 0) || (ctx->st[uVar9 - 1].s != '\t')) {
          bVar6 = ctx->npos;
          uVar18 = bVar6 + 1;
          ctx->npos = uVar18;
          ctx->buf[bVar6] = bVar12;
          if (uVar18 == 0xfe) {
            cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'L');
            if (cVar7 != '\0') goto LAB_0013be2d;
            ctx->npos = '\0';
            json = pbVar2;
            len = iVar1;
            goto LAB_0013bc1b;
          }
        }
        else {
          bVar6 = ctx->pst[ctx->pst_sp].ppos;
          ctx->pst[ctx->pst_sp].ppos = bVar6 + 1;
          ctx->path[bVar6] = bVar12;
        }
        break;
      case 0x49:
      case 0x4a:
        break;
      case 0x4b:
        if (bVar12 == 0x2d && ctx->npos == 0) {
          ctx->f = ctx->f | 1;
        }
        else {
          bVar6 = ctx->dcount;
          if ((byte)(bVar12 - 0x30) < 10 && bVar6 < 0x14) {
            if ((ctx->f & 2) != 0) {
              ctx->f = ctx->f | 4;
            }
            ctx->dcount = bVar6 + 1;
          }
          else {
            if (bVar12 != 0x2e) {
              bVar3 = ctx->f;
              if ((bVar3 & 6) == 2) {
                iVar21 = 0xf5;
                goto LAB_0013bf47;
              }
              if ((bVar12 & 0xdf) == 0x45) {
                if ((bVar3 & 8) == 0) {
                  ctx->f = bVar3 | 8;
                  ctx->st[uVar10].s = 'L';
                  goto LAB_0013bbf2;
                }
              }
              else if (bVar6 != 0) {
                ctx->buf[ctx->npos] = '\0';
                if ((bVar3 & 2) == 0) {
                  bVar12 = ctx->pst_sp;
                  cVar7 = 'I';
                }
                else {
                  bVar12 = ctx->pst_sp;
                  cVar7 = 'J';
                }
                cVar7 = (*ctx->pst[bVar12].callback)(ctx,cVar7);
                if (cVar7 != '\0') goto LAB_0013be2d;
                ctx->st[ctx->sp].s = '\x0e';
                goto LAB_0013bc1b;
              }
              iVar21 = 0xf4;
              goto LAB_0013bf47;
            }
            iVar21 = 0xf4;
            if ((bVar6 == 0) || ((ctx->f & 2) != 0)) goto LAB_0013bf47;
            ctx->f = ctx->f | 2;
          }
        }
        goto LAB_0013bbf2;
      case 0x4c:
        ctx->st[uVar10].s = 'K';
        if ((byte)(bVar12 - 0x30) < 10) goto LAB_0013bc1b;
        if ((uVar15 != 0x2b) && (uVar15 != 0x2d)) {
          iVar21 = 0xf3;
          goto LAB_0013bf47;
        }
LAB_0013bbf2:
        bVar6 = ctx->npos;
        if ((ulong)bVar6 == 0xff) {
          iVar21 = 0xec;
LAB_0013bf47:
          (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x04');
          return iVar21;
        }
        ctx->npos = bVar6 + 1;
        ctx->buf[bVar6] = bVar12;
        break;
      case 0x4d:
        uVar13 = ctx->uni;
        if (uVar15 != (int)"rue alse ull "[uVar13]) {
          iVar21 = 0xf2;
          goto LAB_0013bf47;
        }
        ctx->uni = (uint16_t)(uVar13 + 1);
        if ((0x1108UL >> ((ulong)(uVar13 + 1) & 0x3f) & 1) == 0) break;
        if (uVar13 == 0xb) {
          ctx->buf[0] = '\0';
          lVar19 = (ulong)ctx->pst_sp << 5;
          uVar20 = 0x48;
LAB_0013bc5f:
          cVar7 = (**(code **)((long)&ctx->pst[0].callback + lVar19))(ctx,uVar20);
          if (cVar7 != '\0') goto LAB_0013be2d;
        }
        else {
          if (uVar13 == 7) {
            ctx->buf[0] = '0';
            ctx->buf[1] = '\0';
            lVar19 = (ulong)ctx->pst_sp << 5;
            uVar20 = 0x47;
            goto LAB_0013bc5f;
          }
          if (uVar13 == 2) {
            ctx->buf[0] = '1';
            ctx->buf[1] = '\0';
            lVar19 = (ulong)ctx->pst_sp << 5;
            uVar20 = 0x46;
            goto LAB_0013bc5f;
          }
        }
        ctx->st[ctx->sp].s = '\x0e';
        json = pbVar2;
        len = iVar1;
        goto LAB_0013bc1b;
      default:
        switch(bVar3) {
        case 0:
          if (bVar12 != 0x7b) {
            iVar21 = 0xfe;
            goto LAB_0013bf47;
          }
          cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
          if (cVar7 != '\0') goto LAB_0013be2d;
          ctx->st[ctx->sp].s = '\x01';
          json = pbVar2;
          len = iVar1;
          break;
        case 1:
          if (bVar12 == 0x7d) {
            ctx->st[uVar10].s = '\0';
            iVar21 = 0xfd;
            goto LAB_0013bf47;
          }
          ctx->st[uVar10].s = '\x02';
          break;
        case 2:
          if (bVar12 != 0x22) {
            iVar21 = 0xfc;
            goto LAB_0013bf47;
          }
          ctx->st[uVar10].s = '\t';
          cVar7 = 'C';
          goto LAB_0013b56f;
        default:
          goto switchD_0013b2b9_caseD_49;
        case 9:
          if (bVar12 != 0x3a) {
            iVar21 = 0xf7;
            goto LAB_0013bf47;
          }
          ctx->st[uVar10].s = '\n';
          ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
          lejp_check_path_match(ctx);
          cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x05');
joined_r0x0013b90f:
          json = pbVar2;
          len = iVar1;
          if (cVar7 == '\0') break;
LAB_0013be2d:
          iVar21 = 0xe9;
          goto LAB_0013bf47;
        case 10:
          if (9 < (byte)(bVar12 - 0x30)) {
            iVar21 = 0xf6;
            if (0x65 < bVar12) {
              if (uVar15 == 0x73 || bVar12 < 0x73) {
                if (bVar12 == 0x66) {
                  ctx->uni = 4;
                }
                else {
                  if (bVar12 != 0x6e) goto LAB_0013bf47;
                  ctx->uni = 9;
                }
              }
              else {
                if (bVar12 != 0x74) {
                  if (bVar12 != 0x7b) goto LAB_0013bf47;
                  ctx->st[uVar10].s = '\x0e';
                  lejp_check_path_match(ctx);
                  cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
                  if (cVar7 == '\0') {
                    ctx->path_match = '\0';
                    cVar7 = '\x01';
                    goto LAB_0013b56f;
                  }
                  goto LAB_0013be2d;
                }
                ctx->uni = 0;
              }
              ctx->st[uVar10].s = 'M';
              goto switchD_0013b2b9_caseD_49;
            }
            if (uVar15 == 0x22) {
              ctx->st[uVar10].s = '\x0e';
              ctx->npos = '\0';
              ctx->buf[0] = '\0';
              cVar8 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\v');
              cVar7 = 'C';
              if (cVar8 == '\0') {
LAB_0013b56f:
                puVar11 = &ctx->pst[ctx->pst_sp].ppos;
                bVar12 = ctx->pst[ctx->pst_sp].ppos;
                if (((ulong)bVar12 != 0) && ((ctx->st[ctx->sp].s & 0xfeU) != 0xe)) {
                  *puVar11 = bVar12 + 1;
                  ctx->path[bVar12] = '.';
                }
                bVar12 = *puVar11;
                bVar6 = ctx->sp;
                ctx->st[bVar6].p = bVar12;
                ctx->st[bVar6].i = ctx->ipos;
                bVar6 = bVar6 + 1;
                ctx->sp = bVar6;
                if (bVar6 == 0xc) {
                  iVar21 = 0xee;
                  goto LAB_0013bf47;
                }
                ctx->path[bVar12] = '\0';
                ctx->st[bVar6].s = cVar7;
                ctx->st[bVar6].b = '\0';
                goto switchD_0013b2b9_caseD_49;
              }
            }
            else {
              if (uVar15 != 0x5b) {
                if (uVar15 != 0x5d) goto LAB_0013bf47;
                if (uVar10 == 0) goto LAB_0013bea3;
                bVar6 = bVar6 - 1;
                ctx->sp = bVar6;
                uVar10 = (ulong)bVar6;
                if (ctx->st[uVar10].s != '\x0f') goto LAB_0013beae;
                if (uVar10 != 0) {
                  ctx->pst[ctx->pst_sp].ppos = ctx->st[bVar6 - 1].p;
                  ctx->ipos = ctx->st[uVar10 - 1].i;
                }
                bVar6 = ctx->pst_sp;
                ctx->path[ctx->pst[bVar6].ppos] = '\0';
                if ((ctx->path_match != '\0') && (ctx->pst[bVar6].ppos <= ctx->path_match_len)) {
                  ctx->path_match = '\0';
                }
                goto switchD_0013b2f4_caseD_f;
              }
              ctx->st[uVar10].s = '\x0f';
              bVar12 = ctx->pst_sp;
              bVar6 = ctx->pst[bVar12].ppos;
              ctx->pst[bVar12].ppos = bVar6 + 1;
              ctx->path[bVar6] = '[';
              bVar6 = ctx->pst[bVar12].ppos;
              ctx->pst[bVar12].ppos = bVar6 + 1;
              ctx->path[bVar6] = ']';
              ctx->path[ctx->pst[bVar12].ppos] = '\0';
              cVar7 = (*ctx->pst[bVar12].callback)(ctx,'\x0e');
              if (cVar7 == '\0') {
                bVar12 = ctx->ipos;
                bVar6 = bVar12 + 1;
                ctx->ipos = bVar6;
                ctx->i[bVar12] = 0;
                cVar7 = '\n';
                if (5 < bVar6) {
                  iVar21 = 0xed;
                  goto LAB_0013bf47;
                }
                goto LAB_0013b56f;
              }
            }
            goto LAB_0013be2d;
          }
          ctx->npos = '\0';
          ctx->dcount = '\0';
          ctx->f = '\0';
          ctx->st[uVar10].s = 'K';
          break;
        case 0xe:
          puVar11 = &ctx->pst[ctx->pst_sp].ppos;
          ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
          if (uVar15 == 0x7d) {
            if (uVar10 == 0) {
              lejp_check_path_match(ctx);
              cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
              iVar21 = 0xe9;
              if (cVar7 == '\0') {
                cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x03');
                iVar21 = 0xea;
                if (cVar7 == '\0') {
                  return iVar1;
                }
              }
              goto LAB_0013bf47;
            }
            bVar6 = bVar6 - 1;
            ctx->sp = bVar6;
            if (bVar6 != 0) {
              *puVar11 = ctx->st[bVar6].p;
              ctx->ipos = ctx->st[bVar6].i;
            }
            ctx->path[*puVar11] = '\0';
            if ((ctx->path_match != '\0') && (*puVar11 <= ctx->path_match_len)) {
              ctx->path_match = '\0';
            }
            lejp_check_path_match(ctx);
            cVar7 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
            goto joined_r0x0013b90f;
          }
          if (uVar15 != 0x5d) {
            if (uVar15 != 0x2c) {
              iVar21 = 0xeb;
              goto LAB_0013bf47;
            }
            ctx->st[uVar10].s = '\x02';
            if (uVar10 == 0) {
              *puVar11 = '\0';
              ctx->path_match = '\0';
            }
            else {
              bVar12 = ctx->st[uVar9 - 1].p;
              *puVar11 = bVar12;
              ctx->path[bVar12] = '\0';
              if ((ctx->path_match != '\0') && (*puVar11 <= ctx->path_match_len)) {
                ctx->path_match = '\0';
              }
              if (ctx->st[uVar10 - 1].s == '\x0f') {
                if (ctx->ipos != 0) {
                  ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
                }
                ctx->st[uVar10].s = '\n';
              }
            }
            goto switchD_0013b2b9_caseD_49;
          }
          if (uVar10 == 0) {
LAB_0013bea3:
            iVar21 = 0xf1;
            goto LAB_0013bf47;
          }
          bVar6 = bVar6 - 1;
          ctx->sp = bVar6;
          uVar10 = (ulong)bVar6;
          if (ctx->st[uVar10].s != '\x0f') {
LAB_0013beae:
            iVar21 = 0xf0;
            goto LAB_0013bf47;
          }
          if (uVar10 != 0) {
            *puVar11 = ctx->st[bVar6 - 1].p;
            ctx->ipos = ctx->st[uVar10 - 1].i;
          }
          ctx->path[*puVar11] = '\0';
          if ((ctx->path_match != '\0') && (*puVar11 <= ctx->path_match_len)) {
            ctx->path_match = '\0';
          }
          break;
        case 0xf:
switchD_0013b2f4_caseD_f:
          bVar6 = ctx->pst_sp;
          ctx->path[ctx->pst[bVar6].ppos] = '\0';
          if (bVar12 == 0x5d) {
            ctx->st[ctx->sp].s = '\x0e';
            (*ctx->pst[bVar6].callback)(ctx,'\x0f');
          }
          else {
            if (bVar12 != 0x2c) {
              iVar21 = 0xef;
              goto LAB_0013bf47;
            }
            if (ctx->ipos != 0) {
              ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
            }
            puVar11 = &ctx->pst[bVar6].ppos;
            bVar12 = ctx->sp;
            ctx->st[bVar12].s = '\n';
            if (bVar12 != 0) {
              *puVar11 = ctx->st[bVar12 - 1].p;
            }
            ctx->path[*puVar11] = '\0';
          }
          goto switchD_0013b2b9_caseD_49;
        }
        goto LAB_0013bc1b;
      }
switchD_0013b2b9_caseD_49:
      json = pbVar2;
      len = iVar1;
LAB_0013bc1b:
    } while (len != 0);
  }
  return -1;
}

Assistant:

int
lejp_parse(struct lejp_ctx *ctx, const unsigned char *json, int len)
{
	unsigned char c, n, s, ret = LEJP_REJECT_UNKNOWN;
	static const char esc_char[] = "\"\\/bfnrt";
	static const char esc_tran[] = "\"\\/\b\f\n\r\t";
	static const char tokens[] = "rue alse ull ";

	if (!ctx->sp && !ctx->pst[ctx->pst_sp].ppos)
		ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_START);

	while (len--) {
		c = *json++;
		s = ctx->st[ctx->sp].s;

		/* skip whitespace unless we should care */
		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' || c == '#') {
			if (c == '\n') {
				ctx->line++;
				ctx->st[ctx->sp].s &= ~LEJP_FLAG_WS_COMMENTLINE;
			}
			if (!(s & LEJP_FLAG_WS_KEEP)) {
				if (c == '#')
					ctx->st[ctx->sp].s |=
						LEJP_FLAG_WS_COMMENTLINE;
				continue;
			}
		}

		if (ctx->st[ctx->sp].s & LEJP_FLAG_WS_COMMENTLINE)
			continue;

		switch (s) {
		case LEJP_IDLE:
			if (c != '{') {
				ret = LEJP_REJECT_IDLE_NO_BRACE;
				goto reject;
			}
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MEMBERS;
			break;
		case LEJP_MEMBERS:
			if (c == '}') {
				ctx->st[ctx->sp].s = LEJP_IDLE;
				ret = LEJP_REJECT_MEMBERS_NO_CLOSE;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_M_P;
			goto redo_character;
		case LEJP_M_P:
			if (c != '\"') {
				ret = LEJP_REJECT_MP_NO_OPEN_QUOTE;
				goto reject;
			}
			/* push */
			ctx->st[ctx->sp].s = LEJP_MP_DELIM;
			c = LEJP_MP_STRING;
			goto add_stack_level;

		case LEJP_MP_STRING:
			if (c == '\"') {
				if (!ctx->sp) { /* JSON can't end on quote */
					ret = LEJP_REJECT_MP_STRING_UNDERRUN;
					goto reject;
				}
				if (ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
					ctx->buf[ctx->npos] = '\0';
					if (ctx->pst[ctx->pst_sp].callback(ctx,
						      LEJPCB_VAL_STR_END) < 0) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
				}
				/* pop */
				ctx->sp--;
				break;
			}
			if (c == '\\') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC;
				break;
			}
			if (c < ' ') {/* "control characters" not allowed */
				ret = LEJP_REJECT_MP_ILLEGAL_CTRL;
				goto reject;
			}
			goto emit_string_char;

		case LEJP_MP_STRING_ESC:
			if (c == 'u') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC_U1;
				ctx->uni = 0;
				break;
			}
			for (n = 0; n < sizeof(esc_char); n++) {
				if (c != esc_char[n])
					continue;
				/* found it */
				c = esc_tran[n];
				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			}
			ret = LEJP_REJECT_MP_STRING_ESC_ILLEGAL_ESC;
			/* illegal escape char */
			goto reject;

		case LEJP_MP_STRING_ESC_U1:
		case LEJP_MP_STRING_ESC_U2:
		case LEJP_MP_STRING_ESC_U3:
		case LEJP_MP_STRING_ESC_U4:
			ctx->uni <<= 4;
			if (c >= '0' && c <= '9')
				ctx->uni |= c - '0';
			else
				if (c >= 'a' && c <= 'f')
					ctx->uni = c - 'a' + 10;
				else
					if (c >= 'A' && c <= 'F')
						ctx->uni = c - 'A' + 10;
					else {
						ret = LEJP_REJECT_ILLEGAL_HEX;
						goto reject;
					}
			ctx->st[ctx->sp].s++;
			switch (s) {
			case LEJP_MP_STRING_ESC_U2:
				if (ctx->uni < 0x08)
					break;
				/*
				 * 0x08-0xff (0x0800 - 0xffff)
				 * emit 3-byte UTF-8
				 */
				c = 0xe0 | ((ctx->uni >> 4) & 0xf);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U3:
				if (ctx->uni >= 0x080) {
					/*
					 * 0x080 - 0xfff (0x0800 - 0xffff)
					 * middle 3-byte seq
					 * send ....XXXXXX..
					 */
					c = 0x80 | ((ctx->uni >> 2) & 0x3f);
					goto emit_string_char;
				}
				if (ctx->uni < 0x008)
					break;
				/*
				 * 0x008 - 0x7f (0x0080 - 0x07ff)
				 * start 2-byte seq
				 */
				c = 0xc0 | (ctx->uni >> 2);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U4:
				if (ctx->uni >= 0x0080)
					/* end of 2 or 3-byte seq */
					c = 0x80 | (ctx->uni & 0x3f);
				else
					/* literal */
					c = (unsigned char)ctx->uni;

				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			default:
				break;
			}
			break;

		case LEJP_MP_DELIM:
			if (c != ':') {
				ret = LEJP_REJECT_MP_DELIM_MISSING_COLON;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MP_VALUE;
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';

			lejp_check_path_match(ctx);
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_PAIR_NAME)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE:
			if (c >= '0' && c <= '9') {
				ctx->npos = 0;
				ctx->dcount = 0;
				ctx->f = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
				goto redo_character;
			}
			switch (c) {
			case'\"':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MP_STRING;
				ctx->npos = 0;
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				goto add_stack_level;

			case '{':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MEMBERS;
				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->path_match = 0;
				goto add_stack_level;

			case '[':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_ARRAY_END;
				c = LEJP_MP_VALUE;
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '[';
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = ']';
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->i[ctx->ipos++] = 0;
				if (ctx->ipos > LWS_ARRAY_SIZE(ctx->i)) {
					ret = LEJP_REJECT_MP_DELIM_ISTACK;
					goto reject;
				}
				goto add_stack_level;

			case ']':
				/* pop */
				if (!ctx->sp) { /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;
				goto array_end;

			case 't': /* true */
				ctx->uni = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'f':
				ctx->uni = 4;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'n':
				ctx->uni = 4 + 5;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;
			default:
				ret = LEJP_REJECT_MP_DELIM_BAD_VALUE_START;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE_NUM_INT:
			if (!ctx->npos && c == '-') {
				ctx->f |= LEJP_SEEN_MINUS;
				goto append_npos;
			}

			if (ctx->dcount < 20 && c >= '0' && c <= '9') {
				if (ctx->f & LEJP_SEEN_POINT)
					ctx->f |= LEJP_SEEN_POST_POINT;
				ctx->dcount++;
				goto append_npos;
			}
			if (c == '.') {
				if (!ctx->dcount || (ctx->f & LEJP_SEEN_POINT)) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_POINT;
				goto append_npos;
			}
			/*
			 * before exponent, if we had . we must have had at
			 * least one more digit
			 */
			if ((ctx->f &
				(LEJP_SEEN_POINT | LEJP_SEEN_POST_POINT)) ==
							      LEJP_SEEN_POINT) {
				ret = LEJP_REJECT_MP_VAL_NUM_INT_NO_FRAC;
				goto reject;
			}
			if (c == 'e' || c == 'E') {
				if (ctx->f & LEJP_SEEN_EXP) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_EXP;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_EXP;
				goto append_npos;
			}
			/* if none of the above, did we even have a number? */
			if (!ctx->dcount) {
				ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
				goto reject;
			}

			ctx->buf[ctx->npos] = '\0';
			if (ctx->f & LEJP_SEEN_POINT) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_FLOAT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			} else {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_INT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			}

			/* then this is the post-number character, loop */
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			goto redo_character;

		case LEJP_MP_VALUE_NUM_EXP:
			ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
			if (c >= '0' && c <= '9')
				goto redo_character;
			if (c == '+' || c == '-')
				goto append_npos;
			ret = LEJP_REJECT_MP_VAL_NUM_EXP_BAD_EXP;
			goto reject;

		case LEJP_MP_VALUE_TOK: /* true, false, null */
			if (c != tokens[ctx->uni]) {
				ret = LEJP_REJECT_MP_VAL_TOK_UNKNOWN;
				goto reject;
			}
			ctx->uni++;
			if (tokens[ctx->uni] != ' ')
				break;
			switch (ctx->uni) {
			case 3:
				ctx->buf[0] = '1';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_TRUE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 8:
				ctx->buf[0] = '0';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_FALSE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 12:
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NULL)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			break;

		case LEJP_MP_COMMA_OR_END:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				ctx->st[ctx->sp].s = LEJP_M_P;
				if (!ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = 0;
					/*
					 * since we came back to root level,
					 * no path can still match
					 */
					ctx->path_match = 0;
					break;
				}
				ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				if (ctx->st[ctx->sp - 1].s != LEJP_MP_ARRAY_END)
					break;
				/* top level is definitely an array... */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				break;
			}
			if (c == ']') {
				if (!ctx->sp) {  /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				/* pop */
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				/* do LEJP_MP_ARRAY_END processing */
				goto redo_character;
			}
			if (c == '}') {
				if (!ctx->sp) {
					lejp_check_path_match(ctx);
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_END)) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_COMPLETE))
						goto reject;
					else
						/* done, return unused amount */
						return len;
				}

				/* pop */

				ctx->sp--;
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos =
							ctx->st[ctx->sp].p;
					ctx->ipos = ctx->st[ctx->sp].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <=
						    ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx,
							LEJPCB_OBJECT_END)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}

			ret = LEJP_REJECT_MP_C_OR_E_NEITHER;
			goto reject;

		case LEJP_MP_ARRAY_END:
array_end:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				if (ctx->sp)
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				break;
			}
			if (c != ']') {
				ret = LEJP_REJECT_MP_ARRAY_END_MISSING;
				goto reject;
			}

			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_END);
			break;
		}

		continue;

emit_string_char:
		if (!ctx->sp || ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
			/* assemble the string value into chunks */
			ctx->buf[ctx->npos++] = c;
			if (ctx->npos == sizeof(ctx->buf) - 1) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_CHUNK)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->npos = 0;
			}
			continue;
		}
		/* name part of name:value pair */
		ctx->path[ctx->pst[ctx->pst_sp].ppos++] = c;
		continue;

add_stack_level:
		/* push on to the object stack */
		if (ctx->pst[ctx->pst_sp].ppos &&
		    ctx->st[ctx->sp].s != LEJP_MP_COMMA_OR_END &&
		    ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END)
			ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '.';

		ctx->st[ctx->sp].p = ctx->pst[ctx->pst_sp].ppos;
		ctx->st[ctx->sp].i = ctx->ipos;
		if (++ctx->sp == LWS_ARRAY_SIZE(ctx->st)) {
			ret = LEJP_REJECT_STACK_OVERFLOW;
			goto reject;
		}
		ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
		ctx->st[ctx->sp].s = c;
		ctx->st[ctx->sp].b = 0;
		continue;

append_npos:
		if (ctx->npos >= sizeof(ctx->buf)) {
			ret = LEJP_REJECT_NUM_TOO_LONG;
			goto reject;
		}
		ctx->buf[ctx->npos++] = c;
		continue;

redo_character:
		json--;
		len++;
	}

	return LEJP_CONTINUE;

reject:
	ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_FAILED);
	return ret;
}